

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp.h
# Opt level: O0

double __thiscall atan_fm_demodulator::operator()(atan_fm_demodulator *this,complex<double> *s)

{
  double dVar1;
  complex<double> local_40;
  complex<double> local_30;
  double d;
  complex<double> *s_local;
  atan_fm_demodulator *this_local;
  
  d = (double)s;
  s_local = &this->s1;
  std::conj<double>(&this->s1);
  std::operator*(&local_40,(complex<double> *)d);
  dVar1 = std::arg<double>(&local_30);
  *(undefined8 *)(this->s1)._M_value = *(undefined8 *)d;
  *(undefined8 *)((this->s1)._M_value + 8) = *(undefined8 *)((long)d + 8);
  return dVar1;
}

Assistant:

double operator()(const std::complex<double>& s)
    {
        double d = std::arg(std::conj(s1) * s);
        s1 = s;
        return d;
    }